

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aierror.cpp
# Opt level: O0

void __thiscall Test_aierror_stringFromErrno_Test::TestBody(Test_aierror_stringFromErrno_Test *this)

{
  Test_aierror_stringFromErrno_Test *this_local;
  
  return;
}

Assistant:

TEST_F(Test_aierror, stringFromErrno) {
#ifdef _MSC_VER
    for (auto i=0;i<20;i++)
    {
        _set_errno(i);
        auto str_default = ai::stringFromErrno();
        auto str_explicit = ai::stringFromErrno(i);
        ASSERT_FALSE(str_default.empty());
        ASSERT_EQ(str_default, str_explicit);
    }
#endif
}